

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

_Bool ray_intersect_triangles_with_transform
                (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t,int *idx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  vec3 c;
  undefined1 auVar7 [16];
  _Bool _Var8;
  ulong uVar9;
  int iVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar16;
  float fVar17;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float local_b8;
  float t0;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  float *local_50;
  undefined1 local_48 [24];
  
  p.z = ro.z;
  auVar6._8_4_ = in_XMM0_Dc;
  auVar6._0_8_ = ro._0_8_;
  auVar6._12_4_ = in_XMM0_Dd;
  local_b8 = 3.4028235e+38;
  local_50 = t;
  if (0 < num_points) {
    local_7c = transform.m[0];
    local_80 = transform.m[2];
    local_84 = transform.m[6];
    local_88 = transform.m[7];
    local_8c = transform.m[0xb];
    local_68._0_4_ = rd.x;
    local_68._4_4_ = rd.y;
    local_48._0_4_ = ro.x;
    local_48._4_4_ = ro.y;
    local_68._4_4_ = local_68._4_4_ + (float)local_48._4_4_;
    local_68._0_4_ = (float)local_68 + (float)local_48._0_4_;
    fStack_60 = in_XMM2_Dc + in_XMM0_Dc;
    fStack_5c = in_XMM2_Dd + in_XMM0_Dd;
    pfVar11 = &points[2].z;
    local_b8 = 3.4028235e+38;
    iVar10 = 0;
    uVar9 = 0;
    local_48._0_16_ = auVar6;
    do {
      auVar7 = local_48._0_16_;
      auVar6 = _local_68;
      fVar12 = (float)*(undefined8 *)(pfVar11 + -8);
      fVar14 = (float)((ulong)*(undefined8 *)(pfVar11 + -8) >> 0x20);
      fVar1 = pfVar11[-6];
      a.x = local_80 * fVar1 + local_7c * fVar12 + fVar14 * transform.m[1] + transform.m[3];
      a.y = local_84 * fVar1 + transform.m[4] * fVar12 + fVar14 * transform.m[5] + local_88;
      fVar13 = (float)*(undefined8 *)(pfVar11 + -5);
      fVar15 = (float)((ulong)*(undefined8 *)(pfVar11 + -5) >> 0x20);
      fVar2 = pfVar11[-3];
      b.x = local_80 * fVar2 + local_7c * fVar13 + transform.m[1] * fVar15 + transform.m[3];
      b.y = local_84 * fVar2 + transform.m[4] * fVar13 + transform.m[5] * fVar15 + local_88;
      uVar4 = ((vec3 *)(pfVar11 + -2))->x;
      uVar5 = ((vec3 *)(pfVar11 + -2))->y;
      fVar3 = *pfVar11;
      fVar17 = local_80 * fVar3 + local_7c * (float)uVar4 + transform.m[1] * (float)uVar5 +
               transform.m[3];
      fVar16 = local_84 * fVar3 + transform.m[4] * (float)uVar4 + transform.m[5] * (float)uVar5 +
               local_88;
      local_78 = CONCAT44(fVar16,fVar17);
      local_70 = fVar3 * transform.m[10] +
                 (float)uVar4 * transform.m[8] + (float)uVar5 * transform.m[9] + local_8c;
      a.z = fVar1 * transform.m[10] + fVar12 * transform.m[8] + fVar14 * transform.m[9] + local_8c;
      b.z = fVar2 * transform.m[10] + fVar13 * transform.m[8] + fVar15 * transform.m[9] + local_8c;
      t0 = 3.4028235e+38;
      c.z = local_70;
      c.x = fVar17;
      c.y = fVar16;
      p.x = (float)local_48._0_4_;
      p.y = (float)local_48._4_4_;
      q.z = rd.z + p.z;
      q.x = (float)local_68;
      q.y = local_68._4_4_;
      _local_68 = auVar6;
      local_48._0_16_ = auVar7;
      _Var8 = intersect_segment_triangle(p,q,a,b,c,&t0);
      if ((_Var8) && (t0 < local_b8)) {
        *idx = iVar10;
        local_b8 = t0;
      }
      uVar9 = uVar9 + 3;
      pfVar11 = pfVar11 + 9;
      iVar10 = iVar10 + 1;
    } while (uVar9 < (uint)num_points);
  }
  *local_50 = local_b8;
  return local_b8 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_triangles_with_transform(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t, int *idx) { 
    float min_t = FLT_MAX;  

    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = vec3_apply_mat4(points[i + 0], 1, transform);
        vec3 tp1 = vec3_apply_mat4(points[i + 1], 1, transform);
        vec3 tp2 = vec3_apply_mat4(points[i + 2], 1, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            if (t0 < min_t) {
                min_t = t0;
                *idx = (i / 3);
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}